

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O1

aiMatrix4x4 * __thiscall
Assimp::ColladaParser::CalculateResultTransform
          (aiMatrix4x4 *__return_storage_ptr__,ColladaParser *this,
          vector<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
          *pTransforms)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  pointer pTVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  
  __return_storage_ptr__->a1 = 1.0;
  __return_storage_ptr__->a2 = 0.0;
  __return_storage_ptr__->a3 = 0.0;
  __return_storage_ptr__->a4 = 0.0;
  __return_storage_ptr__->b1 = 0.0;
  __return_storage_ptr__->b2 = 1.0;
  __return_storage_ptr__->b3 = 0.0;
  __return_storage_ptr__->b4 = 0.0;
  __return_storage_ptr__->c1 = 0.0;
  __return_storage_ptr__->c2 = 0.0;
  __return_storage_ptr__->c3 = 1.0;
  __return_storage_ptr__->c4 = 0.0;
  __return_storage_ptr__->d1 = 0.0;
  __return_storage_ptr__->d2 = 0.0;
  __return_storage_ptr__->d3 = 0.0;
  __return_storage_ptr__->d4 = 1.0;
  pTVar8 = (pTransforms->
           super__Vector_base<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pTVar8 != (pTransforms->
                super__Vector_base<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      switch(pTVar8->mType) {
      case TF_LOOKAT:
        fVar1 = pTVar8->f[0];
        fVar2 = pTVar8->f[1];
        fVar3 = pTVar8->f[2];
        fVar10 = pTVar8->f[3];
        fVar11 = pTVar8->f[4];
        fVar12 = pTVar8->f[5];
        fVar13 = pTVar8->f[6];
        fVar15 = pTVar8->f[7];
        fVar16 = pTVar8->f[8];
        fVar17 = fVar16 * fVar16 + fVar13 * fVar13 + fVar15 * fVar15;
        if (fVar17 < 0.0) {
          fVar17 = sqrtf(fVar17);
        }
        else {
          fVar17 = SQRT(fVar17);
        }
        fVar10 = fVar10 - fVar1;
        fVar11 = fVar11 - fVar2;
        fVar12 = fVar12 - fVar3;
        fVar18 = fVar12 * fVar12 + fVar10 * fVar10 + fVar11 * fVar11;
        if (fVar18 < 0.0) {
          fVar18 = sqrtf(fVar18);
        }
        else {
          fVar18 = SQRT(fVar18);
        }
        fVar17 = 1.0 / fVar17;
        fVar13 = fVar13 * fVar17;
        fVar15 = fVar15 * fVar17;
        fVar16 = fVar16 * fVar17;
        fVar18 = 1.0 / fVar18;
        fVar10 = fVar10 * fVar18;
        fVar11 = fVar11 * fVar18;
        fVar12 = fVar12 * fVar18;
        fVar19 = -fVar12;
        fVar17 = fVar11 * fVar16 - fVar15 * fVar12;
        fVar22 = -fVar10;
        fVar12 = fVar12 * fVar13 - fVar16 * fVar10;
        fVar18 = fVar10 * fVar15 - fVar13 * fVar11;
        fVar10 = fVar18 * fVar18 + fVar17 * fVar17 + fVar12 * fVar12;
        if (fVar10 < 0.0) {
          fVar10 = sqrtf(fVar10);
        }
        else {
          fVar10 = SQRT(fVar10);
        }
        fVar10 = 1.0 / fVar10;
        fVar17 = fVar17 * fVar10;
        fVar12 = fVar12 * fVar10;
        fVar10 = fVar10 * fVar18;
        fVar18 = __return_storage_ptr__->a1;
        fVar23 = __return_storage_ptr__->a2;
        fVar24 = __return_storage_ptr__->a3;
        fVar29 = __return_storage_ptr__->a4 * 0.0;
        fVar25 = __return_storage_ptr__->b2;
        fVar26 = __return_storage_ptr__->b1;
        fVar30 = __return_storage_ptr__->b3;
        fVar21 = __return_storage_ptr__->b4 * 0.0;
        fVar31 = __return_storage_ptr__->c2;
        fVar32 = __return_storage_ptr__->c1;
        fVar33 = __return_storage_ptr__->c3;
        fVar27 = __return_storage_ptr__->c4 * 0.0;
        fVar34 = __return_storage_ptr__->d2;
        fVar35 = __return_storage_ptr__->d1;
        fVar20 = __return_storage_ptr__->d3;
        fVar14 = fVar3 * fVar20 + fVar1 * fVar35 + fVar2 * fVar34 + __return_storage_ptr__->d4;
        fVar28 = __return_storage_ptr__->d4 * 0.0;
        __return_storage_ptr__->a1 = fVar10 * fVar24 + fVar17 * fVar18 + fVar23 * fVar12 + fVar29;
        __return_storage_ptr__->a2 = fVar16 * fVar24 + fVar13 * fVar18 + fVar15 * fVar23 + fVar29;
        __return_storage_ptr__->a3 = fVar19 * fVar24 + fVar22 * fVar18 + fVar23 * -fVar11 + fVar29;
        __return_storage_ptr__->a4 =
             fVar24 * fVar3 + fVar18 * fVar1 + fVar2 * fVar23 + __return_storage_ptr__->a4;
        __return_storage_ptr__->b1 = fVar10 * fVar30 + fVar17 * fVar26 + fVar12 * fVar25 + fVar21;
        __return_storage_ptr__->b2 = fVar16 * fVar30 + fVar13 * fVar26 + fVar15 * fVar25 + fVar21;
        __return_storage_ptr__->b3 = fVar19 * fVar30 + fVar22 * fVar26 + fVar25 * -fVar11 + fVar21;
        __return_storage_ptr__->b4 =
             fVar30 * fVar3 + fVar26 * fVar1 + fVar2 * fVar25 + __return_storage_ptr__->b4;
        __return_storage_ptr__->c1 = fVar10 * fVar33 + fVar17 * fVar32 + fVar12 * fVar31 + fVar27;
        __return_storage_ptr__->c2 = fVar16 * fVar33 + fVar13 * fVar32 + fVar15 * fVar31 + fVar27;
        __return_storage_ptr__->c3 = fVar19 * fVar33 + fVar22 * fVar32 + fVar31 * -fVar11 + fVar27;
        __return_storage_ptr__->c4 =
             fVar33 * fVar3 + fVar32 * fVar1 + fVar2 * fVar31 + __return_storage_ptr__->c4;
        __return_storage_ptr__->d1 = fVar10 * fVar20 + fVar17 * fVar35 + fVar12 * fVar34 + fVar28;
        __return_storage_ptr__->d2 = fVar16 * fVar20 + fVar13 * fVar35 + fVar15 * fVar34 + fVar28;
        __return_storage_ptr__->d3 = fVar19 * fVar20 + fVar22 * fVar35 + -fVar11 * fVar34 + fVar28;
        break;
      case TF_ROTATE:
        fVar10 = (pTVar8->f[3] * 3.1415927) / 180.0;
        fVar1 = pTVar8->f[0];
        fVar2 = pTVar8->f[1];
        fVar3 = pTVar8->f[2];
        fVar22 = cosf(fVar10);
        fVar10 = sinf(fVar10);
        fVar12 = 1.0 - fVar22;
        fVar11 = fVar1 * fVar12;
        fVar35 = fVar11 * fVar1 + fVar22;
        fVar31 = fVar11 * fVar2 - fVar3 * fVar10;
        fVar33 = fVar11 * fVar3 + fVar2 * fVar10;
        fVar20 = fVar11 * fVar2 + fVar3 * fVar10;
        fVar32 = fVar2 * fVar2 * fVar12 + fVar22;
        fVar29 = fVar2 * fVar12 * fVar3;
        fVar23 = fVar29 - fVar1 * fVar10;
        fVar34 = fVar11 * fVar3 - fVar2 * fVar10;
        fVar29 = fVar29 + fVar1 * fVar10;
        fVar22 = fVar12 * fVar3 * fVar3 + fVar22;
        fVar1 = __return_storage_ptr__->a1;
        fVar2 = __return_storage_ptr__->a2;
        fVar3 = __return_storage_ptr__->a3;
        fVar24 = __return_storage_ptr__->a4 * 0.0;
        fVar10 = __return_storage_ptr__->b1;
        fVar11 = __return_storage_ptr__->b2;
        fVar12 = __return_storage_ptr__->b3;
        fVar25 = __return_storage_ptr__->b4 * 0.0;
        fVar13 = __return_storage_ptr__->c2;
        fVar15 = __return_storage_ptr__->c1;
        fVar16 = __return_storage_ptr__->c3;
        fVar26 = __return_storage_ptr__->c4 * 0.0;
        fVar17 = __return_storage_ptr__->d2;
        fVar18 = __return_storage_ptr__->d1;
        fVar19 = __return_storage_ptr__->d3;
        fVar14 = fVar19 * 0.0 + fVar18 * 0.0 + fVar17 * 0.0 + __return_storage_ptr__->d4;
        fVar30 = __return_storage_ptr__->d4 * 0.0;
        __return_storage_ptr__->a1 = fVar34 * fVar3 + fVar35 * fVar1 + fVar20 * fVar2 + fVar24;
        __return_storage_ptr__->a2 = fVar29 * fVar3 + fVar31 * fVar1 + fVar2 * fVar32 + fVar24;
        __return_storage_ptr__->a3 = fVar22 * fVar3 + fVar33 * fVar1 + fVar2 * fVar23 + fVar24;
        __return_storage_ptr__->a4 =
             fVar3 * 0.0 + fVar1 * 0.0 + fVar2 * 0.0 + __return_storage_ptr__->a4;
        __return_storage_ptr__->b1 = fVar34 * fVar12 + fVar35 * fVar10 + fVar20 * fVar11 + fVar25;
        __return_storage_ptr__->b2 = fVar29 * fVar12 + fVar31 * fVar10 + fVar32 * fVar11 + fVar25;
        __return_storage_ptr__->b3 = fVar22 * fVar12 + fVar33 * fVar10 + fVar23 * fVar11 + fVar25;
        __return_storage_ptr__->b4 =
             fVar12 * 0.0 + fVar10 * 0.0 + fVar11 * 0.0 + __return_storage_ptr__->b4;
        __return_storage_ptr__->c1 = fVar34 * fVar16 + fVar35 * fVar15 + fVar20 * fVar13 + fVar26;
        __return_storage_ptr__->c2 = fVar29 * fVar16 + fVar31 * fVar15 + fVar32 * fVar13 + fVar26;
        __return_storage_ptr__->c3 = fVar22 * fVar16 + fVar33 * fVar15 + fVar23 * fVar13 + fVar26;
        __return_storage_ptr__->c4 =
             fVar16 * 0.0 + fVar15 * 0.0 + fVar13 * 0.0 + __return_storage_ptr__->c4;
        __return_storage_ptr__->d1 = fVar34 * fVar19 + fVar35 * fVar18 + fVar20 * fVar17 + fVar30;
        __return_storage_ptr__->d2 = fVar29 * fVar19 + fVar31 * fVar18 + fVar32 * fVar17 + fVar30;
        __return_storage_ptr__->d3 = fVar22 * fVar19 + fVar33 * fVar18 + fVar23 * fVar17 + fVar30;
        break;
      case TF_TRANSLATE:
        fVar1 = pTVar8->f[0];
        fVar2 = pTVar8->f[1];
        fVar3 = pTVar8->f[2];
        fVar10 = __return_storage_ptr__->a1;
        fVar11 = __return_storage_ptr__->a2;
        fVar12 = __return_storage_ptr__->a3;
        fVar30 = __return_storage_ptr__->a4 * 0.0;
        fVar13 = __return_storage_ptr__->b1;
        fVar15 = __return_storage_ptr__->b2;
        fVar16 = __return_storage_ptr__->b3;
        fVar31 = __return_storage_ptr__->b4 * 0.0;
        fVar17 = __return_storage_ptr__->c1;
        fVar18 = __return_storage_ptr__->c2;
        fVar19 = __return_storage_ptr__->c3;
        fVar25 = __return_storage_ptr__->c4 * 0.0;
        fVar22 = __return_storage_ptr__->d1;
        fVar23 = __return_storage_ptr__->d2;
        fVar24 = __return_storage_ptr__->d3;
        fVar14 = fVar3 * fVar24 + fVar2 * fVar23 + fVar1 * fVar22 + __return_storage_ptr__->d4;
        fVar26 = __return_storage_ptr__->d4 * 0.0;
        __return_storage_ptr__->a1 = fVar10 + fVar11 * 0.0 + fVar12 * 0.0 + fVar30;
        __return_storage_ptr__->a2 = fVar10 * 0.0 + fVar11 + fVar12 * 0.0 + fVar30;
        __return_storage_ptr__->a3 = fVar10 * 0.0 + fVar11 * 0.0 + fVar12 + fVar30;
        __return_storage_ptr__->a4 =
             fVar12 * fVar3 + fVar11 * fVar2 + fVar1 * fVar10 + __return_storage_ptr__->a4;
        __return_storage_ptr__->b1 = fVar13 + fVar15 * 0.0 + fVar16 * 0.0 + fVar31;
        __return_storage_ptr__->b2 = fVar13 * 0.0 + fVar15 + fVar16 * 0.0 + fVar31;
        __return_storage_ptr__->b3 = fVar13 * 0.0 + fVar15 * 0.0 + fVar16 + fVar31;
        __return_storage_ptr__->b4 =
             fVar16 * fVar3 + fVar15 * fVar2 + fVar1 * fVar13 + __return_storage_ptr__->b4;
        __return_storage_ptr__->c1 = fVar17 + fVar18 * 0.0 + fVar19 * 0.0 + fVar25;
        __return_storage_ptr__->c2 = fVar17 * 0.0 + fVar18 + fVar19 * 0.0 + fVar25;
        __return_storage_ptr__->c3 = fVar17 * 0.0 + fVar18 * 0.0 + fVar19 + fVar25;
        __return_storage_ptr__->c4 =
             fVar19 * fVar3 + fVar18 * fVar2 + fVar1 * fVar17 + __return_storage_ptr__->c4;
        __return_storage_ptr__->d1 = fVar22 + fVar23 * 0.0 + fVar24 * 0.0 + fVar26;
        __return_storage_ptr__->d2 = fVar22 * 0.0 + fVar23 + fVar24 * 0.0 + fVar26;
        __return_storage_ptr__->d3 = fVar22 * 0.0 + fVar23 * 0.0 + fVar24 + fVar26;
        break;
      case TF_SCALE:
        fVar1 = pTVar8->f[0];
        fVar2 = pTVar8->f[1];
        fVar3 = pTVar8->f[2];
        fVar18 = __return_storage_ptr__->a2 * 0.0;
        fVar15 = __return_storage_ptr__->a3 * 0.0;
        fVar12 = __return_storage_ptr__->a1 * 0.0;
        fVar13 = fVar12 + fVar18;
        fVar19 = __return_storage_ptr__->a4 * 0.0;
        fVar25 = __return_storage_ptr__->b2 * 0.0;
        fVar22 = __return_storage_ptr__->b3 * 0.0;
        fVar10 = __return_storage_ptr__->b1 * 0.0;
        fVar11 = fVar10 + fVar25;
        fVar26 = __return_storage_ptr__->b4 * 0.0;
        fVar30 = __return_storage_ptr__->c2 * 0.0;
        fVar23 = __return_storage_ptr__->c1 * 0.0;
        fVar24 = fVar23 + fVar30;
        fVar31 = __return_storage_ptr__->c3 * 0.0;
        fVar32 = __return_storage_ptr__->c4 * 0.0;
        fVar33 = __return_storage_ptr__->d2 * 0.0;
        fVar16 = __return_storage_ptr__->d1 * 0.0;
        fVar17 = fVar16 + fVar33;
        fVar34 = __return_storage_ptr__->d3 * 0.0;
        fVar14 = fVar17 + fVar34 + __return_storage_ptr__->d4;
        fVar35 = __return_storage_ptr__->d4 * 0.0;
        fVar9 = fVar3 * __return_storage_ptr__->d3 + fVar17 + fVar35;
        __return_storage_ptr__->a1 = fVar1 * __return_storage_ptr__->a1 + fVar18 + fVar15 + fVar19;
        __return_storage_ptr__->a2 = __return_storage_ptr__->a2 * fVar2 + fVar12 + fVar15 + fVar19;
        __return_storage_ptr__->a3 = __return_storage_ptr__->a3 * fVar3 + fVar13 + fVar19;
        __return_storage_ptr__->a4 = fVar13 + fVar15 + __return_storage_ptr__->a4;
        __return_storage_ptr__->b1 = fVar1 * __return_storage_ptr__->b1 + fVar25 + fVar22 + fVar26;
        __return_storage_ptr__->b2 = __return_storage_ptr__->b2 * fVar2 + fVar10 + fVar22 + fVar26;
        __return_storage_ptr__->b3 = __return_storage_ptr__->b3 * fVar3 + fVar11 + fVar26;
        __return_storage_ptr__->b4 = fVar11 + fVar22 + __return_storage_ptr__->b4;
        __return_storage_ptr__->c1 = fVar1 * __return_storage_ptr__->c1 + fVar30 + fVar31 + fVar32;
        __return_storage_ptr__->c2 = __return_storage_ptr__->c2 * fVar2 + fVar23 + fVar31 + fVar32;
        __return_storage_ptr__->c3 = __return_storage_ptr__->c3 * fVar3 + fVar24 + fVar32;
        __return_storage_ptr__->c4 = fVar24 + fVar31 + __return_storage_ptr__->c4;
        __return_storage_ptr__->d1 = fVar1 * __return_storage_ptr__->d1 + fVar33 + fVar34 + fVar35;
        __return_storage_ptr__->d2 = fVar2 * __return_storage_ptr__->d2 + fVar16 + fVar34 + fVar35;
        goto LAB_0040cad9;
      case TF_SKEW:
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Collada/ColladaParser.cpp"
                      ,0xd23,
                      "aiMatrix4x4 Assimp::ColladaParser::CalculateResultTransform(const std::vector<Transform> &) const"
                     );
      case TF_MATRIX:
        fVar1 = pTVar8->f[0];
        fVar2 = pTVar8->f[1];
        fVar3 = pTVar8->f[4];
        fVar10 = pTVar8->f[5];
        fVar11 = pTVar8->f[6];
        fVar12 = pTVar8->f[8];
        fVar13 = pTVar8->f[9];
        fVar15 = pTVar8->f[0xc];
        fVar16 = pTVar8->f[0xd];
        fVar17 = __return_storage_ptr__->a1;
        fVar18 = __return_storage_ptr__->a2;
        fVar19 = __return_storage_ptr__->a3;
        fVar22 = __return_storage_ptr__->a4;
        fVar23 = pTVar8->f[2];
        fVar24 = pTVar8->f[10];
        fVar25 = pTVar8->f[0xe];
        fVar26 = pTVar8->f[7];
        fVar30 = pTVar8->f[3];
        fVar31 = pTVar8->f[0xb];
        fVar32 = pTVar8->f[0xf];
        fVar33 = __return_storage_ptr__->b2;
        fVar34 = __return_storage_ptr__->b1;
        fVar35 = __return_storage_ptr__->b3;
        fVar20 = __return_storage_ptr__->b4;
        fVar29 = __return_storage_ptr__->c2;
        fVar21 = __return_storage_ptr__->c1;
        fVar27 = __return_storage_ptr__->c3;
        fVar28 = __return_storage_ptr__->c4;
        fVar4 = __return_storage_ptr__->d2;
        fVar5 = __return_storage_ptr__->d1;
        fVar6 = __return_storage_ptr__->d3;
        fVar7 = __return_storage_ptr__->d4;
        fVar9 = fVar25 * fVar7 + fVar24 * fVar6 + fVar23 * fVar5 + fVar11 * fVar4;
        fVar14 = fVar32 * fVar7 + fVar31 * fVar6 + fVar30 * fVar5 + fVar26 * fVar4;
        __return_storage_ptr__->a1 =
             fVar15 * fVar22 + fVar12 * fVar19 + fVar1 * fVar17 + fVar3 * fVar18;
        __return_storage_ptr__->a2 =
             fVar16 * fVar22 + fVar13 * fVar19 + fVar2 * fVar17 + fVar10 * fVar18;
        __return_storage_ptr__->a3 =
             fVar25 * fVar22 + fVar24 * fVar19 + fVar23 * fVar17 + fVar11 * fVar18;
        __return_storage_ptr__->a4 =
             fVar22 * fVar32 + fVar19 * fVar31 + fVar17 * fVar30 + fVar18 * fVar26;
        __return_storage_ptr__->b1 =
             fVar15 * fVar20 + fVar12 * fVar35 + fVar1 * fVar34 + fVar3 * fVar33;
        __return_storage_ptr__->b2 =
             fVar16 * fVar20 + fVar13 * fVar35 + fVar2 * fVar34 + fVar10 * fVar33;
        __return_storage_ptr__->b3 =
             fVar25 * fVar20 + fVar24 * fVar35 + fVar23 * fVar34 + fVar11 * fVar33;
        __return_storage_ptr__->b4 =
             fVar20 * fVar32 + fVar35 * fVar31 + fVar34 * fVar30 + fVar33 * fVar26;
        __return_storage_ptr__->c1 =
             fVar15 * fVar28 + fVar12 * fVar27 + fVar1 * fVar21 + fVar3 * fVar29;
        __return_storage_ptr__->c2 =
             fVar16 * fVar28 + fVar13 * fVar27 + fVar2 * fVar21 + fVar10 * fVar29;
        __return_storage_ptr__->c3 =
             fVar25 * fVar28 + fVar24 * fVar27 + fVar23 * fVar21 + fVar11 * fVar29;
        __return_storage_ptr__->c4 =
             fVar28 * fVar32 + fVar27 * fVar31 + fVar21 * fVar30 + fVar29 * fVar26;
        __return_storage_ptr__->d1 = fVar15 * fVar7 + fVar12 * fVar6 + fVar1 * fVar5 + fVar3 * fVar4
        ;
        __return_storage_ptr__->d2 =
             fVar16 * fVar7 + fVar13 * fVar6 + fVar2 * fVar5 + fVar10 * fVar4;
LAB_0040cad9:
        __return_storage_ptr__->d3 = fVar9;
        break;
      default:
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Collada/ColladaParser.cpp"
                      ,0xd2d,
                      "aiMatrix4x4 Assimp::ColladaParser::CalculateResultTransform(const std::vector<Transform> &) const"
                     );
      }
      __return_storage_ptr__->d4 = fVar14;
      pTVar8 = pTVar8 + 1;
    } while (pTVar8 != (pTransforms->
                       super__Vector_base<Assimp::Collada::Transform,_std::allocator<Assimp::Collada::Transform>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  return __return_storage_ptr__;
}

Assistant:

aiMatrix4x4 ColladaParser::CalculateResultTransform(const std::vector<Transform>& pTransforms) const
{
    aiMatrix4x4 res;

    for (std::vector<Transform>::const_iterator it = pTransforms.begin(); it != pTransforms.end(); ++it)
    {
        const Transform& tf = *it;
        switch (tf.mType)
        {
        case TF_LOOKAT:
        {
            aiVector3D pos(tf.f[0], tf.f[1], tf.f[2]);
            aiVector3D dstPos(tf.f[3], tf.f[4], tf.f[5]);
            aiVector3D up = aiVector3D(tf.f[6], tf.f[7], tf.f[8]).Normalize();
            aiVector3D dir = aiVector3D(dstPos - pos).Normalize();
            aiVector3D right = (dir ^ up).Normalize();

            res *= aiMatrix4x4(
                right.x, up.x, -dir.x, pos.x,
                right.y, up.y, -dir.y, pos.y,
                right.z, up.z, -dir.z, pos.z,
                0, 0, 0, 1);
            break;
        }
        case TF_ROTATE:
        {
            aiMatrix4x4 rot;
            ai_real angle = tf.f[3] * ai_real(AI_MATH_PI) / ai_real(180.0);
            aiVector3D axis(tf.f[0], tf.f[1], tf.f[2]);
            aiMatrix4x4::Rotation(angle, axis, rot);
            res *= rot;
            break;
        }
        case TF_TRANSLATE:
        {
            aiMatrix4x4 trans;
            aiMatrix4x4::Translation(aiVector3D(tf.f[0], tf.f[1], tf.f[2]), trans);
            res *= trans;
            break;
        }
        case TF_SCALE:
        {
            aiMatrix4x4 scale(tf.f[0], 0.0f, 0.0f, 0.0f, 0.0f, tf.f[1], 0.0f, 0.0f, 0.0f, 0.0f, tf.f[2], 0.0f,
                0.0f, 0.0f, 0.0f, 1.0f);
            res *= scale;
            break;
        }
        case TF_SKEW:
            // TODO: (thom)
            ai_assert(false);
            break;
        case TF_MATRIX:
        {
            aiMatrix4x4 mat(tf.f[0], tf.f[1], tf.f[2], tf.f[3], tf.f[4], tf.f[5], tf.f[6], tf.f[7],
                tf.f[8], tf.f[9], tf.f[10], tf.f[11], tf.f[12], tf.f[13], tf.f[14], tf.f[15]);
            res *= mat;
            break;
        }
        default:
            ai_assert(false);
            break;
        }
    }

    return res;
}